

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O0

void __thiscall VFS::CVFS::CreateDir(CVFS *this,string *Path,bool Force)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  element_type *peVar5;
  CVFSDir *this_00;
  element_type *this_01;
  CVFSException *this_02;
  shared_ptr<VFS::CVFS::CVFSDir> local_148;
  undefined1 local_132;
  allocator<char> local_131;
  string local_130 [3];
  bad_alloc *e;
  shared_ptr<VFS::CVFS::CVFSDir> local_b0;
  undefined1 local_a0 [8];
  VFSDir tmp;
  VFSNode node;
  undefined1 local_70 [8];
  string Dir;
  size_t i;
  VFSDir CurDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Dirs;
  bool Force_local;
  string *Path_local;
  CVFS *this_local;
  
  SplitPath((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&CurDir.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,this,Path);
  std::shared_ptr<VFS::CVFS::CVFSDir>::shared_ptr
            ((shared_ptr<VFS::CVFS::CVFSDir> *)&i,&this->m_Root);
  Dir.field_2._8_8_ = 0;
  do {
    uVar1 = Dir.field_2._8_8_;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&CurDir.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    if (sVar3 <= (ulong)uVar1) {
      std::shared_ptr<VFS::CVFS::CVFSDir>::~shared_ptr((shared_ptr<VFS::CVFS::CVFSDir> *)&i);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&CurDir.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      return;
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&CurDir.
                              super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,Dir.field_2._8_8_);
    std::__cxx11::string::string((string *)local_70,(string *)pvVar4);
    peVar5 = std::__shared_ptr_access<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&i);
    CVFSDir::Search((CVFSDir *)
                    &tmp.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,(string *)peVar5);
    bVar2 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &tmp.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    uVar1 = Dir.field_2._8_8_;
    if ((bVar2) ||
       ((!Force &&
        (sVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&CurDir.
                            super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount), uVar1 != sVar3 - 1)))) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &tmp.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (!bVar2) {
LAB_001152f3:
        local_132 = 1;
        this_02 = (CVFSException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_130,"Can\'t create directory",&local_131);
        CVFSException::CVFSException(this_02,local_130,CANT_CREATE_DIR);
        local_132 = 0;
        __cxa_throw(this_02,&CVFSException::typeinfo,CVFSException::~CVFSException);
      }
      this_01 = std::__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&tmp.
                               super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
      bVar2 = CVFSNode::IsDir(this_01);
      if (!bVar2) goto LAB_001152f3;
      std::static_pointer_cast<VFS::CVFS::CVFSDir,VFS::CVFSNode>
                ((shared_ptr<VFS::CVFSNode> *)&local_148);
      std::shared_ptr<VFS::CVFS::CVFSDir>::operator=
                ((shared_ptr<VFS::CVFS::CVFSDir> *)&i,&local_148);
      std::shared_ptr<VFS::CVFS::CVFSDir>::~shared_ptr(&local_148);
    }
    else {
      std::shared_ptr<VFS::CVFS::CVFSDir>::shared_ptr((shared_ptr<VFS::CVFS::CVFSDir> *)local_a0);
      this_00 = (CVFSDir *)operator_new(0x80);
      CVFSDir::CVFSDir(this_00,(string *)local_70);
      std::shared_ptr<VFS::CVFS::CVFSDir>::shared_ptr<VFS::CVFS::CVFSDir,void>(&local_b0,this_00);
      std::shared_ptr<VFS::CVFS::CVFSDir>::operator=
                ((shared_ptr<VFS::CVFS::CVFSDir> *)local_a0,&local_b0);
      std::shared_ptr<VFS::CVFS::CVFSDir>::~shared_ptr(&local_b0);
      peVar5 = std::
               __shared_ptr_access<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&i);
      std::shared_ptr<VFS::CVFSNode>::shared_ptr<VFS::CVFS::CVFSDir,void>
                ((shared_ptr<VFS::CVFSNode> *)&e,(shared_ptr<VFS::CVFS::CVFSDir> *)local_a0);
      CVFSDir::AppendChild(peVar5,(shared_ptr<VFS::CVFSNode> *)&e);
      std::shared_ptr<VFS::CVFSNode>::~shared_ptr((shared_ptr<VFS::CVFSNode> *)&e);
      std::shared_ptr<VFS::CVFS::CVFSDir>::operator=
                ((shared_ptr<VFS::CVFS::CVFSDir> *)&i,(shared_ptr<VFS::CVFS::CVFSDir> *)local_a0);
      std::shared_ptr<VFS::CVFS::CVFSDir>::~shared_ptr((shared_ptr<VFS::CVFS::CVFSDir> *)local_a0);
    }
    std::shared_ptr<VFS::CVFSNode>::~shared_ptr
              ((shared_ptr<VFS::CVFSNode> *)
               &tmp.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)local_70);
    Dir.field_2._8_8_ = Dir.field_2._8_8_ + 1;
  } while( true );
}

Assistant:

void CreateDir(const std::string &Path, bool Force = false)
            {
                auto Dirs = SplitPath(Path);
                auto CurDir = m_Root;

                for (size_t i = 0; i < Dirs.size(); i++)
                {
                    std::string Dir = Dirs[i];

                    auto node = CurDir->Search(Dir);

                    //Creates the directory either if Force is true or we are at the end of the path.
                    if(!node && (Force || (i == Dirs.size() - 1)))
                    {
                        VFSDir tmp;
                        try
                        {
                            tmp = VFSDir(new CVFSDir(Dir));
                            CurDir->AppendChild(tmp);
                        }
                        catch(const std::bad_alloc &e)
                        {
                            throw CVFSException("Can't create directory. Out of mem. bad_alloc: " + std::string(e.what()), VFSError::OUT_OF_MEM);
                        }
                        
                        CurDir = tmp;
                    }
                    else if(!node || !node->IsDir())
                        throw CVFSException("Can't create directory", VFSError::CANT_CREATE_DIR);
                    else
                        CurDir = std::static_pointer_cast<CVFSDir>(node);
                }               
            }